

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlCatalogPtr xmlCreateNewCatalog(xmlCatalogType type,xmlCatalogPrefer prefer)

{
  xmlHashTablePtr pxVar1;
  xmlCatalogPtr ret;
  xmlCatalogPrefer prefer_local;
  xmlCatalogType type_local;
  
  _prefer_local = (xmlCatalogPtr)(*xmlMalloc)(0x78);
  if (_prefer_local == (xmlCatalogPtr)0x0) {
    xmlCatalogErrMemory();
    _prefer_local = (xmlCatalogPtr)0x0;
  }
  else {
    memset(_prefer_local,0,0x78);
    _prefer_local->type = type;
    _prefer_local->catalNr = 0;
    _prefer_local->catalMax = 10;
    _prefer_local->prefer = prefer;
    if (_prefer_local->type == XML_SGML_CATALOG_TYPE) {
      pxVar1 = xmlHashCreate(10);
      _prefer_local->sgml = pxVar1;
    }
  }
  return _prefer_local;
}

Assistant:

static xmlCatalogPtr
xmlCreateNewCatalog(xmlCatalogType type, xmlCatalogPrefer prefer) {
    xmlCatalogPtr ret;

    ret = (xmlCatalogPtr) xmlMalloc(sizeof(xmlCatalog));
    if (ret == NULL) {
        xmlCatalogErrMemory();
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlCatalog));
    ret->type = type;
    ret->catalNr = 0;
    ret->catalMax = XML_MAX_SGML_CATA_DEPTH;
    ret->prefer = prefer;
    if (ret->type == XML_SGML_CATALOG_TYPE)
	ret->sgml = xmlHashCreate(10);
    return(ret);
}